

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

uint setup_center_error(MACROBLOCKD *xd,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                       MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion)

{
  int iVar1;
  int width;
  int height;
  int iVar2;
  int iVar3;
  aom_variance_fn_ptr_t *paVar4;
  buf_2d *pbVar5;
  buf_2d *pbVar6;
  uint8_t *puVar7;
  uint8_t *pred8;
  uint8_t *puVar8;
  uint uVar9;
  int iVar10;
  uint8_t *ref8;
  uint8_t *comp_pred8;
  uint8_t comp_pred [16384];
  
  paVar4 = var_params->vfp;
  pbVar5 = (var_params->ms_buffers).ref;
  pbVar6 = (var_params->ms_buffers).src;
  iVar10 = pbVar5->stride;
  ref8 = pbVar5->buf + (((int)*bestmv >> 0x13) + ((int)(*bestmv).row >> 3) * iVar10);
  puVar7 = pbVar6->buf;
  iVar1 = pbVar6->stride;
  pred8 = (var_params->ms_buffers).second_pred;
  if (pred8 != (uint8_t *)0x0) {
    width = var_params->w;
    height = var_params->h;
    puVar8 = (var_params->ms_buffers).mask;
    iVar2 = (var_params->ms_buffers).mask_stride;
    iVar3 = (var_params->ms_buffers).inv_mask;
    if ((xd->cur_buf->flags & 8) != 0) {
      comp_pred8 = (uint8_t *)((ulong)comp_pred >> 1);
      if (puVar8 == (uint8_t *)0x0) {
        aom_highbd_comp_avg_pred_c(comp_pred8,pred8,width,height,ref8,iVar10);
      }
      else {
        (*aom_highbd_comp_mask_pred)(comp_pred8,pred8,width,height,ref8,iVar10,puVar8,iVar2,iVar3);
      }
      uVar9 = (*paVar4->vf)(comp_pred8,width,puVar7,iVar1,sse1);
      goto LAB_001c1bfe;
    }
    if (puVar8 == (uint8_t *)0x0) {
      (*aom_comp_avg_pred)(comp_pred,pred8,width,height,ref8,iVar10);
    }
    else {
      (*aom_comp_mask_pred)(comp_pred,pred8,width,height,ref8,iVar10,puVar8,iVar2,iVar3);
    }
    ref8 = comp_pred;
    iVar10 = width;
  }
  uVar9 = (*paVar4->vf)(ref8,iVar10,puVar7,iVar1,sse1);
LAB_001c1bfe:
  *distortion = uVar9;
  iVar10 = mv_err_cost_(bestmv,mv_cost_params);
  return iVar10 + uVar9;
}

Assistant:

static unsigned int setup_center_error(
    const MACROBLOCKD *xd, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;
  const int w = var_params->w;
  const int h = var_params->h;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const uint8_t *src = ms_buffers->src->buf;
  const uint8_t *y = get_buf_from_mv(ms_buffers->ref, *bestmv);
  const int src_stride = ms_buffers->src->stride;
  const int y_stride = ms_buffers->ref->stride;
  const uint8_t *second_pred = ms_buffers->second_pred;
  const uint8_t *mask = ms_buffers->mask;
  const int mask_stride = ms_buffers->mask_stride;
  const int invert_mask = ms_buffers->inv_mask;

  unsigned int besterr;

  if (second_pred != NULL) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_cur_buf_hbd(xd)) {
      DECLARE_ALIGNED(16, uint16_t, comp_pred16[MAX_SB_SQUARE]);
      uint8_t *comp_pred = CONVERT_TO_BYTEPTR(comp_pred16);
      if (mask) {
        aom_highbd_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride,
                                  mask, mask_stride, invert_mask);
      } else {
        aom_highbd_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
      }
      besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
    } else {
      DECLARE_ALIGNED(16, uint8_t, comp_pred[MAX_SB_SQUARE]);
      if (mask) {
        aom_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride, mask,
                           mask_stride, invert_mask);
      } else {
        aom_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
      }
      besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
    }
#else
    (void)xd;
    DECLARE_ALIGNED(16, uint8_t, comp_pred[MAX_SB_SQUARE]);
    if (mask) {
      aom_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride, mask,
                         mask_stride, invert_mask);
    } else {
      aom_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
    }
    besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
#endif
  } else {
    besterr = vfp->vf(y, y_stride, src, src_stride, sse1);
  }
  *distortion = besterr;
  besterr += mv_err_cost_(bestmv, mv_cost_params);
  return besterr;
}